

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void write_subset_seq_parameter_set_rbsp(sps_subset_t *sps_subset,bs_t *b)

{
  sps_svc_ext_t *sps_svc_ext;
  int iVar1;
  
  write_seq_parameter_set_rbsp(sps_subset->sps,b);
  iVar1 = sps_subset->sps->profile_idc;
  if ((iVar1 == 0x56) || (iVar1 == 0x53)) {
    write_seq_parameter_set_svc_extension(sps_subset,b);
    sps_svc_ext = (sps_subset->field_1).sps_svc_ext;
    bs_write_u1(b,(uint)sps_svc_ext->svc_vui_parameters_present_flag);
    if (sps_svc_ext->svc_vui_parameters_present_flag == true) {
      write_svc_vui_parameters_extension(sps_svc_ext,b);
    }
  }
  bs_write_u1(b,(uint)sps_subset->additional_extension2_flag);
  if (sps_subset->additional_extension2_flag == true) {
    while( true ) {
      iVar1 = more_rbsp_data(b);
      if (iVar1 == 0) break;
      bs_write_u1(b,(uint)sps_subset->additional_extension2_flag);
    }
  }
  return;
}

Assistant:

void write_subset_seq_parameter_set_rbsp(sps_subset_t* sps_subset, bs_t* b)
{
    write_seq_parameter_set_rbsp(sps_subset->sps, b);
    
    switch( sps_subset->sps->profile_idc )
    {
        case 83:
        case 86:
            write_seq_parameter_set_svc_extension(sps_subset, b); /* specified in Annex G */
            
            sps_svc_ext_t* sps_svc_ext = sps_subset->sps_svc_ext;
            bs_write_u1(b, sps_svc_ext->svc_vui_parameters_present_flag);
            
            if( sps_svc_ext->svc_vui_parameters_present_flag )
            {
                write_svc_vui_parameters_extension(sps_svc_ext,b); /* specified in Annex G */
            }
            break;
        default:
            break;
    }
    bs_write_u1(b, sps_subset->additional_extension2_flag);
    if( sps_subset->additional_extension2_flag )
    {
        while( more_rbsp_data( b ) )
        {
            bs_write_u1(b, sps_subset->additional_extension2_flag);
        }
    }
    
}